

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Coefficients::InternalSwap(Coefficients *this,Coefficients *other)

{
  Coefficients *other_local;
  Coefficients *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->alpha_,&other->alpha_);
  return;
}

Assistant:

void Coefficients::InternalSwap(Coefficients* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  alpha_.InternalSwap(&other->alpha_);
}